

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

String * kj::_::operator*(String *__return_storage_ptr__,undefined8 *param_2,undefined8 param_3,
                         undefined8 param_4,CappedArray<char,_8UL> *param_5)

{
  CappedArray<char,_8UL> local_40;
  CappedArray<char,_8UL> local_30;
  
  local_30 = Stringifier::operator*((Stringifier *)&STR,*(unsigned_short *)*param_2);
  local_40 = Stringifier::operator*((Stringifier *)&STR,*(unsigned_short *)(param_2 + 1));
  concat<kj::CappedArray<char,8ul>,kj::StringPtr&,kj::CappedArray<char,8ul>>
            (__return_storage_ptr__,(_ *)&local_30,(CappedArray<char,_8UL> *)(param_2 + 2),
             (StringPtr *)&local_40,param_5);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}